

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O2

void __thiscall btRaycastVehicle::debugDraw(btRaycastVehicle *this,btIDebugDraw *debugDrawer)

{
  undefined8 *puVar1;
  btWheelInfo *pbVar2;
  long lVar3;
  long lVar4;
  int v;
  long lVar5;
  btVector3 wheelPosWS;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_50;
  undefined8 local_4c;
  undefined4 local_44;
  undefined1 local_40 [16];
  
  lVar4 = 0x90;
  for (lVar5 = 0; lVar5 < (this->m_wheelInfo).m_size; lVar5 = lVar5 + 1) {
    pbVar2 = (this->m_wheelInfo).m_data;
    local_50 = 0;
    if (*(char *)((long)(pbVar2->m_raycastInfo).m_contactNormalWS.m_floats + lVar4 + -0x3c) == '\0')
    {
      local_50 = 0x3f800000;
    }
    local_4c = 0x3f80000000000000;
    local_44 = 0;
    puVar1 = (undefined8 *)((long)(pbVar2->m_raycastInfo).m_contactNormalWS.m_floats + lVar4);
    local_68 = *puVar1;
    uStack_60 = puVar1[1];
    lVar3 = (long)this->m_indexRightAxis;
    local_40._4_4_ =
         (float)((ulong)local_68 >> 0x20) +
         *(float *)((long)(&(pbVar2->m_raycastInfo).m_contactNormalWS + -2) + lVar3 * 4 + lVar4);
    local_40._0_4_ =
         (float)local_68 +
         *(float *)((long)(&(pbVar2->m_raycastInfo).m_contactNormalWS + -3) + lVar3 * 4 + lVar4);
    local_40._8_4_ =
         *(float *)((long)(&(pbVar2->m_raycastInfo).m_contactNormalWS + -1) + lVar3 * 4 + lVar4) +
         (float)uStack_60;
    local_40._12_4_ = 0;
    (*debugDrawer->_vptr_btIDebugDraw[4])(debugDrawer,&local_68,local_40,&local_50);
    (*debugDrawer->_vptr_btIDebugDraw[4])
              (debugDrawer,&local_68,
               (long)(&(((this->m_wheelInfo).m_data)->m_raycastInfo).m_contactNormalWS + -8) + lVar4
               ,&local_50);
    lVar4 = lVar4 + 0x128;
  }
  return;
}

Assistant:

void	btRaycastVehicle::debugDraw(btIDebugDraw* debugDrawer)
{

	for (int v=0;v<this->getNumWheels();v++)
	{
		btVector3 wheelColor(0,1,1);
		if (getWheelInfo(v).m_raycastInfo.m_isInContact)
		{
			wheelColor.setValue(0,0,1);
		} else
		{
			wheelColor.setValue(1,0,1);
		}

		btVector3 wheelPosWS = getWheelInfo(v).m_worldTransform.getOrigin();

		btVector3 axle = btVector3(	
			getWheelInfo(v).m_worldTransform.getBasis()[0][getRightAxis()],
			getWheelInfo(v).m_worldTransform.getBasis()[1][getRightAxis()],
			getWheelInfo(v).m_worldTransform.getBasis()[2][getRightAxis()]);

		//debug wheels (cylinders)
		debugDrawer->drawLine(wheelPosWS,wheelPosWS+axle,wheelColor);
		debugDrawer->drawLine(wheelPosWS,getWheelInfo(v).m_raycastInfo.m_contactPointWS,wheelColor);

	}
}